

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int setupLookaside(sqlite3 *db,void *pBuf,int sz,int cnt)

{
  int iVar1;
  LookasideSlot *pLVar2;
  ulong uVar3;
  u32 uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  LookasideSlot *pLVar9;
  u64 n;
  uint uVar10;
  LookasideSlot *p;
  LookasideSlot *pLVar11;
  
  iVar1 = sqlite3LookasideUsed(db,(int *)0x0);
  if (0 < iVar1) {
    return 5;
  }
  if ((db->lookaside).bMalloced != '\0') {
    sqlite3_free((db->lookaside).pStart);
  }
  uVar10 = sz & 0xfffffff8;
  uVar8 = 0;
  if (8 < (int)uVar10) {
    uVar8 = uVar10;
  }
  if ((int)uVar10 < 9 || cnt < 1) {
    (db->lookaside).szTrue = 0;
    (db->lookaside).pInit = (LookasideSlot *)0x0;
    (db->lookaside).pFree = (LookasideSlot *)0x0;
  }
  else {
    n = (long)cnt * (long)sz;
    pLVar2 = (LookasideSlot *)pBuf;
    if (pBuf == (void *)0x0) {
      if (sqlite3Hooks_0 != (code *)0x0) {
        (*sqlite3Hooks_0)();
      }
      pLVar2 = (LookasideSlot *)sqlite3Malloc(n);
      if (sqlite3Hooks_1 != (code *)0x0) {
        (*sqlite3Hooks_1)();
      }
      if (pLVar2 == (LookasideSlot *)0x0) {
        pLVar2 = (LookasideSlot *)0x0;
      }
      else {
        iVar1 = (*sqlite3Config.m.xSize)(pLVar2);
        n = (u64)iVar1;
      }
    }
    if ((uint)sz < 0x180) {
      if ((uint)sz < 0x100) {
        uVar3 = (long)n / (long)(ulong)uVar10;
        uVar6 = 0;
      }
      else {
        uVar3 = (long)n / (long)(ulong)(uVar10 + 0x80);
        lVar5 = (long)(int)(uVar10 * (int)uVar3);
        uVar7 = n - lVar5;
        uVar6 = (n - lVar5) + 0x7f;
        if (-1 < (long)uVar7) {
          uVar6 = uVar7;
        }
        uVar6 = uVar6 >> 7;
      }
    }
    else {
      uVar3 = (long)n / (long)(ulong)(uVar10 + 0x180);
      lVar5 = (long)(int)(uVar10 * (int)uVar3);
      uVar7 = n - lVar5;
      uVar6 = (n - lVar5) + 0x7f;
      if (-1 < (long)uVar7) {
        uVar6 = uVar7;
      }
      uVar6 = uVar6 >> 7;
      uVar8 = uVar10;
    }
    (db->lookaside).pStart = pLVar2;
    (db->lookaside).pInit = (LookasideSlot *)0x0;
    (db->lookaside).pFree = (LookasideSlot *)0x0;
    (db->lookaside).sz = (u16)uVar8;
    (db->lookaside).szTrue = (u16)uVar8;
    if (pLVar2 != (LookasideSlot *)0x0) {
      if (0 < (int)uVar3) {
        uVar7 = uVar3 & 0xffffffff;
        pLVar9 = (LookasideSlot *)0x0;
        pLVar11 = pLVar2;
        do {
          pLVar11->pNext = pLVar9;
          pLVar2 = (LookasideSlot *)((long)&pLVar11->pNext + (ulong)uVar8);
          uVar10 = (int)uVar7 - 1;
          uVar7 = (ulong)uVar10;
          pLVar9 = pLVar11;
          pLVar11 = pLVar2;
        } while (uVar10 != 0);
        (db->lookaside).pInit = (LookasideSlot *)((long)pLVar2 - (ulong)uVar8);
      }
      (db->lookaside).pSmallInit = (LookasideSlot *)0x0;
      (db->lookaside).pSmallFree = (LookasideSlot *)0x0;
      (db->lookaside).pMiddle = pLVar2;
      if (0 < (int)uVar6) {
        uVar7 = uVar6 & 0xffffffff;
        pLVar9 = (LookasideSlot *)0x0;
        do {
          pLVar11 = pLVar2;
          pLVar11->pNext = pLVar9;
          pLVar2 = pLVar11 + 0x10;
          uVar8 = (int)uVar7 - 1;
          uVar7 = (ulong)uVar8;
          pLVar9 = pLVar11;
        } while (uVar8 != 0);
        (db->lookaside).pSmallInit = pLVar11;
      }
      (db->lookaside).pEnd = pLVar2;
      (db->lookaside).bDisable = 0;
      (db->lookaside).bMalloced = pBuf == (void *)0x0;
      uVar4 = (int)uVar6 + (int)uVar3;
      goto LAB_001220f6;
    }
  }
  (db->lookaside).pStart = db;
  (db->lookaside).pSmallInit = (LookasideSlot *)0x0;
  (db->lookaside).pSmallFree = (LookasideSlot *)0x0;
  (db->lookaside).pMiddle = db;
  (db->lookaside).pEnd = db;
  (db->lookaside).bDisable = 1;
  (db->lookaside).sz = 0;
  (db->lookaside).bMalloced = '\0';
  uVar4 = 0;
LAB_001220f6:
  (db->lookaside).nSlot = uVar4;
  return 0;
}

Assistant:

static int setupLookaside(sqlite3 *db, void *pBuf, int sz, int cnt){
#ifndef SQLITE_OMIT_LOOKASIDE
  void *pStart;
  sqlite3_int64 szAlloc = sz*(sqlite3_int64)cnt;
  int nBig;   /* Number of full-size slots */
  int nSm;    /* Number smaller LOOKASIDE_SMALL-byte slots */

  if( sqlite3LookasideUsed(db,0)>0 ){
    return SQLITE_BUSY;
  }
  /* Free any existing lookaside buffer for this handle before
  ** allocating a new one so we don't have to have space for
  ** both at the same time.
  */
  if( db->lookaside.bMalloced ){
    sqlite3_free(db->lookaside.pStart);
  }
  /* The size of a lookaside slot after ROUNDDOWN8 needs to be larger
  ** than a pointer to be useful.
  */
  sz = ROUNDDOWN8(sz);  /* IMP: R-33038-09382 */
  if( sz<=(int)sizeof(LookasideSlot*) ) sz = 0;
  if( cnt<0 ) cnt = 0;
  if( sz==0 || cnt==0 ){
    sz = 0;
    pStart = 0;
  }else if( pBuf==0 ){
    sqlite3BeginBenignMalloc();
    pStart = sqlite3Malloc( szAlloc );  /* IMP: R-61949-35727 */
    sqlite3EndBenignMalloc();
    if( pStart ) szAlloc = sqlite3MallocSize(pStart);
  }else{
    pStart = pBuf;
  }
#ifndef SQLITE_OMIT_TWOSIZE_LOOKASIDE
  if( sz>=LOOKASIDE_SMALL*3 ){
    nBig = szAlloc/(3*LOOKASIDE_SMALL+sz);
    nSm = (szAlloc - sz*nBig)/LOOKASIDE_SMALL;
  }else if( sz>=LOOKASIDE_SMALL*2 ){
    nBig = szAlloc/(LOOKASIDE_SMALL+sz);
    nSm = (szAlloc - sz*nBig)/LOOKASIDE_SMALL;
  }else
#endif /* SQLITE_OMIT_TWOSIZE_LOOKASIDE */
  if( sz>0 ){
    nBig = szAlloc/sz;
    nSm = 0;
  }else{
    nBig = nSm = 0;
  }
  db->lookaside.pStart = pStart;
  db->lookaside.pInit = 0;
  db->lookaside.pFree = 0;
  db->lookaside.sz = (u16)sz;
  db->lookaside.szTrue = (u16)sz;
  if( pStart ){
    int i;
    LookasideSlot *p;
    assert( sz > (int)sizeof(LookasideSlot*) );
    p = (LookasideSlot*)pStart;
    for(i=0; i<nBig; i++){
      p->pNext = db->lookaside.pInit;
      db->lookaside.pInit = p;
      p = (LookasideSlot*)&((u8*)p)[sz];
    }
#ifndef SQLITE_OMIT_TWOSIZE_LOOKASIDE
    db->lookaside.pSmallInit = 0;
    db->lookaside.pSmallFree = 0;
    db->lookaside.pMiddle = p;
    for(i=0; i<nSm; i++){
      p->pNext = db->lookaside.pSmallInit;
      db->lookaside.pSmallInit = p;
      p = (LookasideSlot*)&((u8*)p)[LOOKASIDE_SMALL];
    }
#endif /* SQLITE_OMIT_TWOSIZE_LOOKASIDE */
    assert( ((uptr)p)<=szAlloc + (uptr)pStart );
    db->lookaside.pEnd = p;
    db->lookaside.bDisable = 0;
    db->lookaside.bMalloced = pBuf==0 ?1:0;
    db->lookaside.nSlot = nBig+nSm;
  }else{
    db->lookaside.pStart = db;
#ifndef SQLITE_OMIT_TWOSIZE_LOOKASIDE
    db->lookaside.pSmallInit = 0;
    db->lookaside.pSmallFree = 0;
    db->lookaside.pMiddle = db;
#endif /* SQLITE_OMIT_TWOSIZE_LOOKASIDE */
    db->lookaside.pEnd = db;
    db->lookaside.bDisable = 1;
    db->lookaside.sz = 0;
    db->lookaside.bMalloced = 0;
    db->lookaside.nSlot = 0;
  }
  assert( sqlite3LookasideUsed(db,0)==0 );
#endif /* SQLITE_OMIT_LOOKASIDE */
  return SQLITE_OK;
}